

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> *in_RDI;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffd0;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_28
  ;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  *local_20;
  undefined4 local_c;
  
  bVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::empty
                    ((vector<std::thread,_std::allocator<std::thread>_> *)
                     in_stack_ffffffffffffffd0._M_current);
  if (bVar1) {
    local_c = 1;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
    *(undefined1 *)&in_RDI[0xf]._M_current = 1;
    std::condition_variable::notify_all();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x109a40);
    local_20 = in_RDI + 0xc;
    local_28._M_current =
         (thread *)
         std::vector<std::thread,_std::allocator<std::thread>_>::begin
                   ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffd0 =
         std::vector<std::thread,_std::allocator<std::thread>_>::end
                   ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffb8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&local_28);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&local_28);
    }
    local_c = 0;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             in_stack_ffffffffffffffd0._M_current);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 6));
  return;
}

Assistant:

ThreadPool::~ThreadPool() {
    if (threads.empty())
        return;

    {
        std::lock_guard<std::mutex> lock(jobListMutex);
        shutdownThreads = true;
        jobListCondition.notify_all();
    }

    for (std::thread &thread : threads)
        thread.join();
}